

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

int32_t __thiscall
charls::jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>
::decode_run_pixels(jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>
                    *this,pixel_type ra,pixel_type *start_pos,int32_t pixel_count)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar31;
  undefined1 auVar29 [16];
  int iVar32;
  undefined1 auVar30 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar35 [16];
  long lVar12;
  
  iVar9 = 0;
  do {
    bVar4 = decoder_strategy::read_bit(&this->super_decoder_strategy);
    if (!bVar4) {
      if (pixel_count != iVar9) {
        if (*(int32_t *)(J + (long)this->run_index_ * 4) < 1) {
          iVar5 = 0;
        }
        else {
          iVar5 = decoder_strategy::read_value
                            (&this->super_decoder_strategy,
                             *(int32_t *)(J + (long)this->run_index_ * 4));
        }
        bVar4 = pixel_count < iVar5 + iVar9;
        pixel_count = iVar5 + iVar9;
        if (bVar4) {
          jls_codec<charls::default_traits<unsigned_short,unsigned_short>,charls::decoder_strategy>
          ::decode_run_pixels();
LAB_0010dc79:
          __assert_fail("index <= pixel_count",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                        ,0x2d2,
                        "int32_t charls::jls_codec<charls::default_traits<unsigned short, unsigned short>, charls::decoder_strategy>::decode_run_pixels(pixel_type, pixel_type *, const int32_t) [Traits = charls::default_traits<unsigned short, unsigned short>, Strategy = charls::decoder_strategy]"
                       );
        }
      }
      break;
    }
    iVar5 = this->run_index_;
    iVar8 = 1 << (J[(long)iVar5 * 4] & 0x1f);
    iVar6 = pixel_count - iVar9;
    iVar32 = iVar8;
    if (iVar6 < iVar8) {
      iVar32 = iVar6;
    }
    iVar9 = iVar9 + iVar32;
    if (pixel_count < iVar9) goto LAB_0010dc79;
    if (iVar8 <= iVar6) {
      if (0x1d < iVar5) {
        iVar5 = 0x1e;
      }
      this->run_index_ = iVar5 + 1;
    }
  } while (iVar9 != pixel_count);
  auVar3 = _DAT_001266d0;
  if (0 < pixel_count) {
    lVar7 = (ulong)(uint)pixel_count - 1;
    auVar10._8_4_ = (int)lVar7;
    auVar10._0_8_ = lVar7;
    auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
    lVar7 = 0;
    auVar10 = auVar10 ^ _DAT_001266d0;
    auVar11 = _DAT_00126690;
    auVar13 = _DAT_001266a0;
    auVar14 = _DAT_001266b0;
    auVar15 = _DAT_001266c0;
    do {
      auVar16 = auVar15 ^ auVar3;
      iVar9 = auVar10._0_4_;
      iVar8 = -(uint)(iVar9 < auVar16._0_4_);
      iVar5 = auVar10._4_4_;
      auVar17._4_4_ = -(uint)(iVar5 < auVar16._4_4_);
      iVar32 = auVar10._8_4_;
      iVar31 = -(uint)(iVar32 < auVar16._8_4_);
      iVar6 = auVar10._12_4_;
      auVar17._12_4_ = -(uint)(iVar6 < auVar16._12_4_);
      auVar26._4_4_ = iVar8;
      auVar26._0_4_ = iVar8;
      auVar26._8_4_ = iVar31;
      auVar26._12_4_ = iVar31;
      auVar33 = pshuflw(in_XMM11,auVar26,0xe8);
      auVar19._4_4_ = -(uint)(auVar16._4_4_ == iVar5);
      auVar19._12_4_ = -(uint)(auVar16._12_4_ == iVar6);
      auVar19._0_4_ = auVar19._4_4_;
      auVar19._8_4_ = auVar19._12_4_;
      auVar35 = pshuflw(in_XMM12,auVar19,0xe8);
      auVar17._0_4_ = auVar17._4_4_;
      auVar17._8_4_ = auVar17._12_4_;
      auVar34 = pshuflw(auVar33,auVar17,0xe8);
      auVar16._8_4_ = 0xffffffff;
      auVar16._0_8_ = 0xffffffffffffffff;
      auVar16._12_4_ = 0xffffffff;
      auVar16 = (auVar34 | auVar35 & auVar33) ^ auVar16;
      auVar16 = packssdw(auVar16,auVar16);
      if ((auVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(pixel_type *)((long)start_pos + lVar7) = ra;
      }
      auVar17 = auVar19 & auVar26 | auVar17;
      auVar16 = packssdw(auVar17,auVar17);
      auVar34._8_4_ = 0xffffffff;
      auVar34._0_8_ = 0xffffffffffffffff;
      auVar34._12_4_ = 0xffffffff;
      auVar16 = packssdw(auVar16 ^ auVar34,auVar16 ^ auVar34);
      if ((auVar16._0_4_ >> 0x10 & 1) != 0) {
        *(pixel_type *)((long)start_pos + lVar7 + 2) = ra;
      }
      auVar16 = auVar14 ^ auVar3;
      iVar8 = -(uint)(iVar9 < auVar16._0_4_);
      auVar29._4_4_ = -(uint)(iVar5 < auVar16._4_4_);
      iVar31 = -(uint)(iVar32 < auVar16._8_4_);
      auVar29._12_4_ = -(uint)(iVar6 < auVar16._12_4_);
      auVar18._4_4_ = iVar8;
      auVar18._0_4_ = iVar8;
      auVar18._8_4_ = iVar31;
      auVar18._12_4_ = iVar31;
      auVar25._4_4_ = -(uint)(auVar16._4_4_ == iVar5);
      auVar25._12_4_ = -(uint)(auVar16._12_4_ == iVar6);
      auVar25._0_4_ = auVar25._4_4_;
      auVar25._8_4_ = auVar25._12_4_;
      auVar29._0_4_ = auVar29._4_4_;
      auVar29._8_4_ = auVar29._12_4_;
      auVar16 = auVar25 & auVar18 | auVar29;
      auVar16 = packssdw(auVar16,auVar16);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar16 = packssdw(auVar16 ^ auVar1,auVar16 ^ auVar1);
      if ((auVar16 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(pixel_type *)((long)start_pos + lVar7 + 4) = ra;
      }
      auVar19 = pshufhw(auVar18,auVar18,0x84);
      auVar26 = pshufhw(auVar25,auVar25,0x84);
      auVar17 = pshufhw(auVar19,auVar29,0x84);
      auVar20._8_4_ = 0xffffffff;
      auVar20._0_8_ = 0xffffffffffffffff;
      auVar20._12_4_ = 0xffffffff;
      auVar20 = (auVar17 | auVar26 & auVar19) ^ auVar20;
      auVar19 = packssdw(auVar20,auVar20);
      if ((auVar19 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(pixel_type *)((long)start_pos + lVar7 + 6) = ra;
      }
      auVar19 = auVar13 ^ auVar3;
      iVar8 = -(uint)(iVar9 < auVar19._0_4_);
      auVar22._4_4_ = -(uint)(iVar5 < auVar19._4_4_);
      iVar31 = -(uint)(iVar32 < auVar19._8_4_);
      auVar22._12_4_ = -(uint)(iVar6 < auVar19._12_4_);
      auVar27._4_4_ = iVar8;
      auVar27._0_4_ = iVar8;
      auVar27._8_4_ = iVar31;
      auVar27._12_4_ = iVar31;
      auVar16 = pshuflw(auVar16,auVar27,0xe8);
      auVar21._4_4_ = -(uint)(auVar19._4_4_ == iVar5);
      auVar21._12_4_ = -(uint)(auVar19._12_4_ == iVar6);
      auVar21._0_4_ = auVar21._4_4_;
      auVar21._8_4_ = auVar21._12_4_;
      in_XMM12 = pshuflw(auVar35 & auVar33,auVar21,0xe8);
      in_XMM12 = in_XMM12 & auVar16;
      auVar22._0_4_ = auVar22._4_4_;
      auVar22._8_4_ = auVar22._12_4_;
      auVar16 = pshuflw(auVar16,auVar22,0xe8);
      auVar33._8_4_ = 0xffffffff;
      auVar33._0_8_ = 0xffffffffffffffff;
      auVar33._12_4_ = 0xffffffff;
      auVar33 = (auVar16 | in_XMM12) ^ auVar33;
      auVar16 = packssdw(auVar33,auVar33);
      if ((auVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(pixel_type *)((long)start_pos + lVar7 + 8) = ra;
      }
      auVar22 = auVar21 & auVar27 | auVar22;
      auVar16 = packssdw(auVar22,auVar22);
      auVar35._8_4_ = 0xffffffff;
      auVar35._0_8_ = 0xffffffffffffffff;
      auVar35._12_4_ = 0xffffffff;
      auVar16 = packssdw(auVar16 ^ auVar35,auVar16 ^ auVar35);
      if ((auVar16 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(pixel_type *)((long)start_pos + lVar7 + 10) = ra;
      }
      auVar16 = auVar11 ^ auVar3;
      iVar9 = -(uint)(iVar9 < auVar16._0_4_);
      auVar30._4_4_ = -(uint)(iVar5 < auVar16._4_4_);
      iVar32 = -(uint)(iVar32 < auVar16._8_4_);
      auVar30._12_4_ = -(uint)(iVar6 < auVar16._12_4_);
      auVar23._4_4_ = iVar9;
      auVar23._0_4_ = iVar9;
      auVar23._8_4_ = iVar32;
      auVar23._12_4_ = iVar32;
      auVar28._4_4_ = -(uint)(auVar16._4_4_ == iVar5);
      auVar28._12_4_ = -(uint)(auVar16._12_4_ == iVar6);
      auVar28._0_4_ = auVar28._4_4_;
      auVar28._8_4_ = auVar28._12_4_;
      auVar30._0_4_ = auVar30._4_4_;
      auVar30._8_4_ = auVar30._12_4_;
      auVar16 = auVar28 & auVar23 | auVar30;
      auVar16 = packssdw(auVar16,auVar16);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      in_XMM11 = packssdw(auVar16 ^ auVar2,auVar16 ^ auVar2);
      if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(pixel_type *)((long)start_pos + lVar7 + 0xc) = ra;
      }
      auVar16 = pshufhw(auVar23,auVar23,0x84);
      auVar17 = pshufhw(auVar28,auVar28,0x84);
      auVar19 = pshufhw(auVar16,auVar30,0x84);
      auVar24._8_4_ = 0xffffffff;
      auVar24._0_8_ = 0xffffffffffffffff;
      auVar24._12_4_ = 0xffffffff;
      auVar24 = (auVar19 | auVar17 & auVar16) ^ auVar24;
      auVar16 = packssdw(auVar24,auVar24);
      if ((auVar16 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(pixel_type *)((long)start_pos + lVar7 + 0xe) = ra;
      }
      lVar12 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 8;
      auVar15._8_8_ = lVar12 + 8;
      lVar12 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 8;
      auVar14._8_8_ = lVar12 + 8;
      lVar12 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 8;
      auVar13._8_8_ = lVar12 + 8;
      lVar12 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 8;
      auVar11._8_8_ = lVar12 + 8;
      lVar7 = lVar7 + 0x10;
    } while ((ulong)(pixel_count + 7U >> 3) << 4 != lVar7);
  }
  return pixel_count;
}

Assistant:

int32_t decode_run_pixels(pixel_type ra, pixel_type* start_pos, const int32_t pixel_count)
    {
        int32_t index{};
        while (Strategy::read_bit())
        {
            const int count{std::min(1 << J[run_index_], pixel_count - index)};
            index += count;
            ASSERT(index <= pixel_count);

            if (count == (1 << J[run_index_]))
            {
                increment_run_index();
            }

            if (index == pixel_count)
                break;
        }

        if (index != pixel_count)
        {
            // incomplete run.
            index += (J[run_index_] > 0) ? Strategy::read_value(J[run_index_]) : 0;
        }

        if (UNLIKELY(index > pixel_count))
            impl::throw_jpegls_error(jpegls_errc::invalid_encoded_data);

        for (int32_t i{}; i < index; ++i)
        {
            start_pos[i] = ra;
        }

        return index;
    }